

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreUtil.cpp
# Opt level: O0

ImageType vkt::image::getImageTypeForSingleLayer(ImageType imageType)

{
  ImageType local_c;
  ImageType imageType_local;
  
  switch(imageType) {
  case IMAGE_TYPE_1D:
  case IMAGE_TYPE_1D_ARRAY:
    local_c = IMAGE_TYPE_1D;
    break;
  case IMAGE_TYPE_2D:
  case IMAGE_TYPE_2D_ARRAY:
  case IMAGE_TYPE_CUBE:
  case IMAGE_TYPE_CUBE_ARRAY:
    local_c = IMAGE_TYPE_2D;
    break;
  case IMAGE_TYPE_3D:
    local_c = IMAGE_TYPE_3D;
    break;
  case IMAGE_TYPE_BUFFER:
    local_c = IMAGE_TYPE_BUFFER;
    break;
  default:
    local_c = IMAGE_TYPE_LAST;
  }
  return local_c;
}

Assistant:

ImageType getImageTypeForSingleLayer (const ImageType imageType)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_1D_ARRAY:
			return IMAGE_TYPE_1D;

		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			// A single layer for cube is a 2d face
			return IMAGE_TYPE_2D;

		case IMAGE_TYPE_3D:
			return IMAGE_TYPE_3D;

		case IMAGE_TYPE_BUFFER:
			return IMAGE_TYPE_BUFFER;

		default:
			DE_FATAL("Internal test error");
			return IMAGE_TYPE_LAST;
	}
}